

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Binary * __thiscall
wasm::Builder::makeBinary(Builder *this,BinaryOp op,Expression *left,Expression *right)

{
  Binary *pBVar1;
  
  pBVar1 = MixedArena::alloc<wasm::Binary>(&this->wasm->allocator);
  pBVar1->op = op;
  pBVar1->left = left;
  pBVar1->right = right;
  ::wasm::Binary::finalize();
  return pBVar1;
}

Assistant:

Binary* makeBinary(BinaryOp op, Expression* left, Expression* right) {
    auto* ret = wasm.allocator.alloc<Binary>();
    ret->op = op;
    ret->left = left;
    ret->right = right;
    ret->finalize();
    return ret;
  }